

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall
tokenized_prompt::tokenized_prompt
          (tokenized_prompt *this,llama_context *ctx,string *pos,string *neg)

{
  undefined1 add_special;
  string *text;
  vector<int,_std::allocator<int>_> *pvVar1;
  size_type len;
  unsigned_long *puVar2;
  llama_context *in_RDX;
  undefined8 in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  bool add_bos;
  llama_vocab *vocab;
  llama_model *model;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff28;
  vector<int,_std::allocator<int>_> *__x;
  undefined1 in_stack_ffffffffffffff3e;
  llama_context *in_stack_ffffffffffffff88;
  tokenized_prompt *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> local_60;
  byte local_41;
  string *local_40;
  undefined8 local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17e31b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17e32e);
  local_28 = llama_get_model(local_10);
  text = (string *)llama_model_get_vocab(local_28);
  local_40 = text;
  add_special = llama_vocab_get_add_bos(text);
  local_41 = add_special & 1;
  common_tokenize(in_RDX,text,(bool)add_special,(bool)in_stack_ffffffffffffff3e);
  pvVar1 = &local_60;
  std::vector<int,_std::allocator<int>_>::operator=(pvVar1,in_stack_ffffffffffffff28);
  std::vector<int,_std::allocator<int>_>::~vector(pvVar1);
  common_tokenize(in_RDX,text,(bool)add_special,(bool)in_stack_ffffffffffffff3e);
  __x = in_RDI + 1;
  std::vector<int,_std::allocator<int>_>::operator=(pvVar1,__x);
  std::vector<int,_std::allocator<int>_>::~vector(pvVar1);
  pvVar1 = (vector<int,_std::allocator<int>_> *)std::vector<int,_std::allocator<int>_>::size(in_RDI)
  ;
  len = std::vector<int,_std::allocator<int>_>::size(__x);
  puVar2 = std::max<unsigned_long>
                     ((unsigned_long *)&stack0xffffffffffffff80,
                      (unsigned_long *)&stack0xffffffffffffff78);
  in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)*puVar2;
  padding_seq(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,pvVar1,len);
  padding_seq(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,pvVar1,len);
  return;
}

Assistant:

tokenized_prompt(llama_context * ctx, std::string pos, std::string neg) {
        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);
        const bool add_bos = llama_vocab_get_add_bos(vocab);
        tokens_pos = common_tokenize(ctx, pos, add_bos, true);
        tokens_neg = common_tokenize(ctx, neg, add_bos, true);
        max_seq_len = std::max(tokens_pos.size(), tokens_neg.size());
        padding_seq(ctx, tokens_pos, max_seq_len);
        padding_seq(ctx, tokens_neg, max_seq_len);
    }